

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::auxIsConnected(Graph *this,Vertex *v,int *n_markeds)

{
  bool bVar1;
  ostream *this_00;
  Vertex *v_00;
  Edge *local_28;
  Edge *a;
  int *n_markeds_local;
  Vertex *v_local;
  Graph *this_local;
  
  if (v == (Vertex *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"\n No NULL \n");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    bVar1 = Vertex::getMarked(v);
    if (!bVar1) {
      Vertex::setMarked(v,true);
      *n_markeds = *n_markeds + 1;
      for (local_28 = Vertex::getEdgesList(v); local_28 != (Edge *)0x0;
          local_28 = Edge::getNext(local_28)) {
        while( true ) {
          bVar1 = false;
          if (local_28 != (Edge *)0x0) {
            bVar1 = Edge::isClosed(local_28);
            bVar1 = !bVar1;
          }
          if (!bVar1) break;
          local_28 = Edge::getNext(local_28);
        }
        if (local_28 == (Edge *)0x0) {
          return;
        }
        v_00 = Edge::getDestiny(local_28);
        auxIsConnected(this,v_00,n_markeds);
      }
    }
  }
  return;
}

Assistant:

void Graph::auxIsConnected(Vertex *v, int &n_markeds){
    if(v == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        if(v->getMarked() == false){
            v->setMarked(true);
            n_markeds++;

            for(Edge *a= v->getEdgesList(); a!=NULL; a= a->getNext()){

                //nao descer por arcos com chave aberta
                while(a!=NULL && a->isClosed() == false){
                    a = a->getNext();
                }

                if(a==NULL)
                    break;

                auxIsConnected(a->getDestiny(), n_markeds);
            }
        }
    }
}